

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O1

void fiber_entry(void *argsp)

{
  char *msg;
  char *local_20;
  
  fprintf((FILE *)out,"%s\n","fiber_entry()");
  fiber_switch(*argsp,*(Fiber **)((long)argsp + 8));
  fiber_exec_on(*argsp,*(Fiber **)((long)argsp + 8),run_put_str,"some string");
  fiber_exec_on(*argsp,*(Fiber **)((long)argsp + 8),run_put_str,"some other string");
  fprintf((FILE *)out,"%s\n","again fiber_entry()");
  fiber_reserve_return(*(Fiber **)((long)argsp + 8),run_put_str,&local_20,0x10000);
  memset(local_20 + 0x1b,0,0xffe5);
  builtin_strncpy(local_20,"Pushed onto toplevel fiber",0x1b);
  fiber_switch(*argsp,*(Fiber **)((long)argsp + 8));
  return;
}

Assistant:

static void
fiber_entry(void *argsp)
{
    FiberArgs *args = (FiberArgs *) argsp;
    println("fiber_entry()");
    fiber_switch(args->self, args->caller);

    put_str(args->self, args->caller, "some string");
    put_str(args->self, args->caller, "some other string");

    println("again fiber_entry()");
    char *msg;
    size_t sz = 64 * 1024;
    fiber_reserve_return(args->caller, run_put_str, (void **) &msg, sz);
    memset(msg, 0, sz);
    strcpy(msg, "Pushed onto toplevel fiber");
    fiber_switch(args->self, args->caller);
}